

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitAtomicWait(PrintExpressionContents *this,AtomicWait *curr)

{
  bool bVar1;
  ostream *poVar2;
  address64_t aVar3;
  Module *in_R8;
  Name name;
  char *local_68;
  bool local_49;
  BasicType local_34 [3];
  uintptr_t local_28;
  Type local_20;
  Type type;
  AtomicWait *curr_local;
  PrintExpressionContents *this_local;
  
  type.id = (uintptr_t)curr;
  prepareColor(this->o);
  local_28 = *(uintptr_t *)(type.id + 0x30);
  local_20 = forceConcrete(local_28);
  local_34[2] = 2;
  bVar1 = wasm::Type::operator==(&local_20,local_34 + 2);
  local_49 = true;
  if (!bVar1) {
    local_34[1] = 3;
    local_49 = wasm::Type::operator==(&local_20,local_34 + 1);
  }
  if (local_49 == false) {
    __assert_fail("type == Type::i32 || type == Type::i64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                  ,0x2d8,"void wasm::PrintExpressionContents::visitAtomicWait(AtomicWait *)");
  }
  poVar2 = std::operator<<(this->o,"memory.atomic.wait");
  local_34[0] = i32;
  bVar1 = wasm::Type::operator==(&local_20,local_34);
  if (bVar1) {
    local_68 = "HEAPF32";
  }
  else {
    local_68 = "HEAPF64";
  }
  local_68 = local_68 + 5;
  std::operator<<(poVar2,local_68);
  restoreNormalColor(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = *(size_t *)(type.id + 0x40);
  anon_unknown_0::printMemoryName
            (*(anon_unknown_0 **)(type.id + 0x38),name,(ostream *)this->wasm,in_R8);
  aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)(type.id + 0x10));
  if (aVar3 != 0) {
    poVar2 = std::operator<<(this->o," offset=");
    aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)(type.id + 0x10));
    std::ostream::operator<<(poVar2,aVar3);
  }
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    prepareColor(o);
    Type type = forceConcrete(curr->expectedType);
    assert(type == Type::i32 || type == Type::i64);
    o << "memory.atomic.wait" << (type == Type::i32 ? "32" : "64");
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }